

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result wabt::ReadBinary(void *data,size_t size,BinaryReaderDelegate *delegate,
                       ReadBinaryOptions *options)

{
  Result RVar1;
  int iVar2;
  Enum EVar3;
  char *format;
  uint32_t magic;
  BinaryReader reader;
  uint local_108;
  uint local_104;
  BinaryReader local_100;
  
  local_100.state_.offset = 0;
  local_100.read_end_ = size;
  local_100.state_.data = (uint8_t *)data;
  local_100.state_.size = size;
  BinaryReaderLogging::BinaryReaderLogging
            (&local_100.logging_delegate_,options->log_stream,delegate);
  local_100.delegate_ = &local_100.logging_delegate_.super_BinaryReaderDelegate;
  if (options->log_stream == (Stream *)0x0) {
    local_100.delegate_ = delegate;
  }
  local_100.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100.last_known_section_ = Invalid;
  local_100.did_read_names_section_ = false;
  local_100.reading_custom_section_ = false;
  local_100.num_func_imports_ = 0;
  local_100.num_table_imports_ = 0;
  local_100.num_memory_imports_ = 0;
  local_100.num_global_imports_ = 0;
  local_100.num_event_imports_ = 0;
  local_100.num_function_signatures_ = 0;
  local_100.num_function_bodies_ = 0;
  local_100.data_count_ = 0xffffffff;
  local_100.options_ = options;
  (*delegate->_vptr_BinaryReaderDelegate[3])(delegate,&local_100.state_);
  local_104 = 0;
  RVar1 = anon_unknown_24::BinaryReader::ReadT<unsigned_int>
                    (&local_100,&local_104,"uint32_t","magic");
  EVar3 = Error;
  if (RVar1.enum_ == Error) goto LAB_001aa3b4;
  if (local_104 == 0x6d736100) {
    local_108 = 0;
    RVar1 = anon_unknown_24::BinaryReader::ReadT<unsigned_int>
                      (&local_100,&local_108,"uint32_t","version");
    EVar3 = Error;
    if (RVar1.enum_ == Error) goto LAB_001aa3b4;
    if (local_108 != 1) {
      anon_unknown_24::BinaryReader::PrintError
                (&local_100,"bad wasm file version: %#x (expected %#x)",(ulong)local_108,1);
      goto LAB_001aa3b4;
    }
    iVar2 = (*(local_100.delegate_)->_vptr_BinaryReaderDelegate[4])(local_100.delegate_,1);
    if (iVar2 == 0) {
      RVar1 = anon_unknown_24::BinaryReader::ReadSections(&local_100);
      if (RVar1.enum_ == Error) goto LAB_001aa3b4;
      if (local_100.num_function_signatures_ == local_100.num_function_bodies_) {
        iVar2 = (*(local_100.delegate_)->_vptr_BinaryReaderDelegate[5])();
        if (iVar2 == 0) {
          EVar3 = Ok;
          goto LAB_001aa3b4;
        }
        format = "EndModule callback failed";
      }
      else {
        format = "function signature count != function body count";
      }
    }
    else {
      format = "BeginModule callback failed";
    }
  }
  else {
    format = "bad magic value";
  }
  EVar3 = Error;
  anon_unknown_24::BinaryReader::PrintError(&local_100,format);
LAB_001aa3b4:
  if (local_100.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.target_depths_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_100.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.fields_.
                    super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_100.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.result_types_.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_100.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.param_types_.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (Result)EVar3;
}

Assistant:

Result ReadBinary(const void* data,
                  size_t size,
                  BinaryReaderDelegate* delegate,
                  const ReadBinaryOptions& options) {
  BinaryReader reader(data, size, delegate, options);
  return reader.ReadModule();
}